

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O2

void __thiscall TEST_GROUP_CppUTestGroupPluginTest::setup(TEST_GROUP_CppUTestGroupPluginTest *this)

{
  DummyPlugin *pDVar1;
  DummyPluginWhichAcceptsParameters *this_00;
  TestTestingFixture *this_01;
  TestRegistry *pTVar2;
  SimpleString local_20;
  
  pDVar1 = (DummyPlugin *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                        ,0x5d);
  SimpleString::SimpleString(&local_20,"GenericPlugin");
  DummyPlugin::DummyPlugin(pDVar1,&local_20);
  this->firstPlugin = pDVar1;
  SimpleString::~SimpleString(&local_20);
  this_00 = (DummyPluginWhichAcceptsParameters *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x5e);
  SimpleString::SimpleString(&local_20,"GenericPlugin2");
  DummyPluginWhichAcceptsParameters::DummyPluginWhichAcceptsParameters(this_00,&local_20);
  this->secondPlugin = this_00;
  SimpleString::~SimpleString(&local_20);
  pDVar1 = (DummyPlugin *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                        ,0x5f);
  SimpleString::SimpleString(&local_20,"GenericPlugin3");
  DummyPlugin::DummyPlugin(pDVar1,&local_20);
  this->thirdPlugin = pDVar1;
  SimpleString::~SimpleString(&local_20);
  this_01 = (TestTestingFixture *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x60);
  TestTestingFixture::TestTestingFixture(this_01);
  this->genFixture = this_01;
  pTVar2 = TestTestingFixture::getRegistry(this_01);
  this->registry = pTVar2;
  (*pTVar2->_vptr_TestRegistry[0xd])(pTVar2,this->firstPlugin);
  sequenceNumber = 1;
  return;
}

Assistant:

void setup() _override
    {
        firstPlugin = new DummyPlugin(GENERIC_PLUGIN);
        secondPlugin = new DummyPluginWhichAcceptsParameters(GENERIC_PLUGIN2);
        thirdPlugin = new DummyPlugin(GENERIC_PLUGIN3);
        genFixture = new TestTestingFixture;
        registry = genFixture->getRegistry();
        registry->installPlugin(firstPlugin);
        sequenceNumber = 1;
    }